

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O0

Extra_ImageTree_t *
Extra_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,
                   DdNode **pbVars,int fVerbose)

{
  int iVar1;
  Extra_ImagePart_t **pParts_00;
  Extra_ImageVar_t **pVars_00;
  Extra_ImageNode_t **pNodes_00;
  Extra_ImageTree_t *__s;
  Extra_ImageNode_t *pEVar2;
  DdNode *pDVar3;
  int local_5c;
  int v;
  Extra_ImageNode_t **pNodes;
  Extra_ImageVar_t **pVars;
  Extra_ImagePart_t **pParts;
  Extra_ImageTree_t *pTree;
  DdNode **pbVars_local;
  int nVars_local;
  DdNode **pbParts_local;
  int nParts_local;
  DdNode *bCare_local;
  DdManager *dd_local;
  
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    Extra_bddImagePrintLatchDependency(dd,bCare,nParts,pbParts,nVars,pbVars);
  }
  pParts_00 = Extra_CreateParts(dd,nParts,pbParts,bCare);
  pVars_00 = Extra_CreateVars(dd,nParts + 1,pParts_00,nVars,pbVars);
  pNodes_00 = Extra_CreateNodes(dd,nParts + 1,pParts_00,dd->size,pVars_00);
  __s = (Extra_ImageTree_t *)malloc(0x28);
  memset(__s,0,0x28);
  __s->pCare = pNodes_00[nParts];
  __s->fVerbose = fVerbose;
  do {
    iVar1 = Extra_BuildTreeNode(dd,nParts + 1,pNodes_00,dd->size,pVars_00);
  } while (iVar1 != 0);
  local_5c = 0;
  while( true ) {
    if (dd->size <= local_5c) {
      if (pVars_00 != (Extra_ImageVar_t **)0x0) {
        free(pVars_00);
      }
      do {
        pEVar2 = Extra_MergeTopNodes(dd,nParts + 1,pNodes_00);
        __s->pRoot = pEVar2;
      } while (pEVar2 == (Extra_ImageNode_t *)0x0);
      local_5c = 0;
      while( true ) {
        if (nParts + 1 <= local_5c) {
          if (pNodes_00 != (Extra_ImageNode_t **)0x0) {
            free(pNodes_00);
          }
          pDVar3 = Cudd_Support(dd,bCare);
          __s->bCareSupp = pDVar3;
          Cudd_Ref(__s->bCareSupp);
          Extra_DeleteParts_rec(__s->pRoot);
          if (pParts_00 != (Extra_ImagePart_t **)0x0) {
            free(pParts_00);
          }
          return __s;
        }
        if (pNodes_00[local_5c] != (Extra_ImageNode_t *)0x0) break;
        local_5c = local_5c + 1;
      }
      __assert_fail("pNodes[v] == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                    ,0xc2,
                    "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
                   );
    }
    if (pVars_00[local_5c] != (Extra_ImageVar_t *)0x0) break;
    local_5c = local_5c + 1;
  }
  __assert_fail("pVars[v] == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                ,0xba,
                "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
               );
}

Assistant:

Extra_ImageTree_t * Extra_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Extra_ImageTree_t * pTree;
    Extra_ImagePart_t ** pParts;
    Extra_ImageVar_t ** pVars;
    Extra_ImageNode_t ** pNodes;
    int v;

    if ( fVerbose && dd->size <= 80 )
        Extra_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Extra_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Extra_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Extra_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Extra_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Extra_ImageTree_t) );
    pTree->pCare = pNodes[nParts];
    pTree->fVerbose = fVerbose;

    // process the nodes
    while ( Extra_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars ) );

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );

    // merge the topmost nodes
    while ( (pTree->pRoot = Extra_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Extra_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Extra_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );
    return pTree;
}